

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.cpp
# Opt level: O0

void __thiscall
Storage::Encodings::MFM::Encoder::output_short(Encoder *this,uint16_t value,uint16_t fuzzy_mask)

{
  vector<bool,_std::allocator<bool>_> *this_00;
  size_type __new_size;
  ushort local_18;
  ushort local_12;
  uint16_t mask;
  bool write_fuzzy_bits;
  uint16_t fuzzy_mask_local;
  uint16_t value_local;
  Encoder *this_local;
  
  local_12 = value;
  if (fuzzy_mask != 0) {
    if (this->fuzzy_target_ == (vector<bool,_std::allocator<bool>_> *)0x0) {
      __assert_fail("fuzzy_target_",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Storage/Disk/Encodings/MFM/Encoder.cpp"
                    ,0x13e,
                    "virtual void Storage::Encodings::MFM::Encoder::output_short(uint16_t, uint16_t)"
                   );
    }
    this_00 = this->fuzzy_target_;
    __new_size = std::vector<bool,_std::allocator<bool>_>::size(this->target_);
    std::vector<bool,_std::allocator<bool>_>::resize(this_00,__new_size,false);
    local_12 = value & (fuzzy_mask ^ 0xffff);
  }
  for (local_18 = 0x8000; local_18 != 0; local_18 = (ushort)((int)(uint)local_18 >> 1)) {
    std::vector<bool,_std::allocator<bool>_>::push_back(this->target_,(local_12 & local_18) != 0);
    if (fuzzy_mask != 0) {
      std::vector<bool,_std::allocator<bool>_>::push_back
                (this->fuzzy_target_,(fuzzy_mask & local_18) != 0);
    }
  }
  return;
}

Assistant:

void Encoder::output_short(uint16_t value, uint16_t fuzzy_mask) {
	const bool write_fuzzy_bits = fuzzy_mask;

	if(write_fuzzy_bits) {
		assert(fuzzy_target_);

		// Zero-fill the bits to date, to cover any shorts written without fuzzy bits,
		// and make sure the value has a 0 anywhere it should be fuzzy.
		fuzzy_target_->resize(target_->size());
		value &= ~fuzzy_mask;
	}

	uint16_t mask = 0x8000;
	while(mask) {
		target_->push_back(value & mask);
		if(write_fuzzy_bits) fuzzy_target_->push_back(fuzzy_mask & mask);
		mask >>= 1;
	}
}